

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O0

void cpp_wrapper_delete(planck_unit_test_t *tc,Dictionary<int,_int> *dict,int key,
                       ion_err_t expected_status,ion_result_count_t expected_count,
                       ion_boolean_t check_result)

{
  planck_unit_result_t pVar1;
  ion_status_t iVar2;
  char local_30;
  int32_t iStack_2c;
  ion_status_t status;
  ion_boolean_t check_result_local;
  ion_result_count_t expected_count_local;
  ion_err_t expected_status_local;
  int key_local;
  Dictionary<int,_int> *dict_local;
  planck_unit_test_t *tc_local;
  
  iVar2 = Dictionary<int,_int>::deleteRecord(dict,key);
  local_30 = iVar2.error;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,(int)expected_status,(int)local_30,0x10b,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  iStack_2c = iVar2.count;
  pVar1 = planck_unit_assert_int_are_equal
                    (tc,expected_count,iStack_2c,0x10c,
                     "/workspace/llm4binary/github/license_c_cmakelists/iondbproject[P]iondb/src/tests/unit/cpp_wrapper/test1/test_cpp_wrapper1.cpp"
                    );
  if (pVar1 == '\0') {
    longjmp((__jmp_buf_tag *)planck_unit_longjmp_env,1);
  }
  if (check_result != '\0') {
    cpp_wrapper_get(tc,dict,key,999,'\x01',0);
  }
  return;
}

Assistant:

void
cpp_wrapper_delete(
	planck_unit_test_t *tc,
	Dictionary<int, int>	*dict,
	int key,
	ion_err_t expected_status,
	ion_result_count_t expected_count,
	ion_boolean_t check_result
) {
	ion_status_t status = dict->deleteRecord(key);

	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_status, status.error);
	PLANCK_UNIT_ASSERT_INT_ARE_EQUAL(tc, expected_count, status.count);

	if (check_result) {
		cpp_wrapper_get(tc, dict, key, NULL_VALUE, err_item_not_found, 0);
	}
}